

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pointer.h
# Opt level: O3

Data * __thiscall
Corrade::Containers::Pointer<Corrade::TestSuite::Tester::Printer::Data>::operator->
          (Pointer<Corrade::TestSuite::Tester::Printer::Data> *this)

{
  undefined8 uVar1;
  Debug local_30 [40];
  
  if (this->_pointer != (Data *)0x0) {
    return this->_pointer;
  }
  uVar1 = Corrade::Utility::Error::defaultOutput();
  Corrade::Utility::Error::Error((Error *)local_30,uVar1,0);
  Corrade::Utility::Debug::operator<<(local_30,"Containers::Pointer: the pointer is null");
  Corrade::Utility::Error::~Error((Error *)local_30);
  abort();
}

Assistant:

const T* operator->() const {
            CORRADE_DEBUG_ASSERT(_pointer, "Containers::Pointer: the pointer is null", nullptr);
            return _pointer;
        }